

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileEncoding.cpp
# Opt level: O0

bool Assimp::STEP::StringToUTF8(string *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  byte *pbVar13;
  long lVar14;
  ulong uVar15;
  unsigned_short *__p;
  type puVar16;
  uchar *puVar17;
  pointer start;
  pointer puVar18;
  pointer puVar19;
  pointer puVar20;
  uint *__p_00;
  type puVar21;
  pointer start_00;
  size_t outcount_2;
  uchar *destt_1;
  uint32_t *srct_1;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> dest_1;
  size_t dcount_1;
  size_t k_1;
  char *cur_1;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> src_1;
  size_t count_1;
  size_t outcount_1;
  uchar *destt;
  uint16_t *srct;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> dest;
  size_t dcount;
  _Head_base<0UL,_unsigned_short_*,_false> local_80;
  size_t k;
  char *cur;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> src;
  size_t count;
  size_t jend;
  size_t j;
  size_t basei;
  size_t outcount;
  uchar *tempp;
  uint32_t **ppuStack_30;
  uchar temp [5];
  uint32_t *univalp;
  uint32_t unival;
  uint8_t macval;
  uint8_t ch;
  size_t i;
  string *s_local;
  
  _unival = (char *)0x0;
  i = (size_t)s;
  do {
    while( true ) {
      pcVar12 = _unival;
      pcVar11 = (char *)std::__cxx11::string::size();
      if (pcVar11 <= pcVar12) {
        return true;
      }
      pcVar12 = (char *)std::__cxx11::string::operator[](i);
      if (*pcVar12 == '\\') break;
LAB_00b9d3df:
      _unival = _unival + 1;
    }
    pcVar12 = _unival + 3;
    pcVar11 = (char *)std::__cxx11::string::size();
    if (((pcVar12 < pcVar11) &&
        (pcVar12 = (char *)std::__cxx11::string::operator[](i), *pcVar12 == 'S')) &&
       (pcVar12 = (char *)std::__cxx11::string::operator[](i), *pcVar12 == '\\')) {
      pbVar13 = (byte *)std::__cxx11::string::operator[](i);
      if (0x7f < *pbVar13) {
        __assert_fail("(uint8_t)s[i+3] < 0x80",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/STEPParser/STEPFileEncoding.cpp"
                      ,0x12a,"bool Assimp::STEP::StringToUTF8(std::string &)");
      }
      pcVar12 = (char *)std::__cxx11::string::operator[](i);
      univalp._7_1_ = *pcVar12 + 0x80;
      uVar10 = (uint)univalp._7_1_;
      pbVar13 = (byte *)std::__cxx11::string::operator[](i);
      *pbVar13 = (byte)((int)(uVar10 & 0xc0) >> 6) | 0xc0;
      bVar6 = univalp._7_1_ & 0x3f;
      pbVar13 = (byte *)std::__cxx11::string::operator[](i);
      *pbVar13 = bVar6 | 0x80;
      std::__cxx11::string::erase(i,(ulong)(_unival + 2));
      _unival = _unival + 1;
      goto LAB_00b9d3df;
    }
    pcVar12 = _unival + 4;
    pcVar11 = (char *)std::__cxx11::string::size();
    if (((pcVar12 < pcVar11) &&
        (pcVar12 = (char *)std::__cxx11::string::operator[](i), *pcVar12 == 'X')) &&
       (pcVar12 = (char *)std::__cxx11::string::operator[](i), *pcVar12 == '\\')) {
      lVar14 = std::__cxx11::string::c_str();
      univalp._6_1_ = HexOctetToDecimal(_unival + lVar14 + 3);
      if (univalp._6_1_ < 0x20) {
        return false;
      }
      univalp._0_4_ = (uint)mac_codetable[(int)(univalp._6_1_ - 0x20)];
      ppuStack_30 = &univalp;
      utf8::utf32to8<unsigned_char*,unsigned_int_const*>
                ((uint *)ppuStack_30,(uint *)((long)&univalp + 4),(uchar *)((long)&tempp + 3));
      std::__cxx11::string::erase(i,(ulong)_unival);
      std::__cxx11::string::insert(i,_unival,(long)&tempp + 3);
      _unival = _unival + (((long)&tempp + 3) - ((long)&tempp + 3));
      goto LAB_00b9d3df;
    }
    pcVar12 = _unival + 3;
    pcVar11 = (char *)std::__cxx11::string::size();
    if (((pcVar11 <= pcVar12) ||
        (pcVar12 = (char *)std::__cxx11::string::operator[](i), *pcVar12 != 'X')) ||
       ((pcVar12 = (char *)std::__cxx11::string::operator[](i), *pcVar12 < '0' ||
        (pcVar12 = (char *)std::__cxx11::string::operator[](i), '9' < *pcVar12))))
    goto LAB_00b9d3df;
    pcVar12 = (char *)std::__cxx11::string::operator[](i);
    if ((*pcVar12 != '2') && (*pcVar12 != '4')) {
      return false;
    }
    pcVar12 = (char *)std::__cxx11::string::operator[](i);
    if (*pcVar12 != '\\') goto LAB_00b9d3df;
    pcVar12 = _unival + 4;
    lVar14 = std::__cxx11::string::size();
    jend = (size_t)pcVar12;
    while ((jend < lVar14 - 3U &&
           ((((pcVar11 = (char *)std::__cxx11::string::operator[](i), *pcVar11 != '\\' ||
              (pcVar11 = (char *)std::__cxx11::string::operator[](i), *pcVar11 != 'X')) ||
             (pcVar11 = (char *)std::__cxx11::string::operator[](i), *pcVar11 != '0')) ||
            (pcVar11 = (char *)std::__cxx11::string::operator[](i), *pcVar11 != '\\'))))) {
      jend = jend + 1;
    }
    if (jend == lVar14 - 3U) {
      return false;
    }
    if ((char *)jend == pcVar12) {
      std::__cxx11::string::erase(i,(ulong)_unival);
    }
    else {
      pcVar11 = (char *)std::__cxx11::string::operator[](i);
      if (*pcVar11 == '2') {
        if ((jend - (long)pcVar12 & 3) != 0) {
          return false;
        }
        src._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
        super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true>)
             (jend - (long)pcVar12 >> 2);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = src._M_t.
                       super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                       .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
        uVar15 = SUB168(auVar1 * ZEXT816(2),0);
        if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
          uVar15 = 0xffffffffffffffff;
        }
        __p = (unsigned_short *)operator_new__(uVar15);
        std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>::
        unique_ptr<unsigned_short*,std::default_delete<unsigned_short[]>,void,bool>
                  ((unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>> *)&cur,__p);
        lVar14 = std::__cxx11::string::c_str();
        k = (size_t)(pcVar12 + lVar14);
        for (local_80._M_head_impl = (unsigned_short *)0x0;
            local_80._M_head_impl <
            (ulong)src._M_t.
                   super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
            local_80._M_head_impl = local_80._M_head_impl + 1) {
          uVar4 = HexOctetToDecimal((char *)k);
          uVar5 = HexOctetToDecimal((char *)(k + 2));
          puVar16 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::
                    operator[]((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>
                                *)&cur,(size_t)local_80._M_head_impl);
          *puVar16 = CONCAT11(uVar4,uVar5);
          k = k + 4;
        }
        dest._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             ((long)src._M_t.
                    super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                    .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl * 3);
        puVar17 = (uchar *)operator_new__((ulong)dest._M_t.
                                                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                 .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                 _M_head_impl);
        std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
        unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
                  ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&srct,puVar17
                  );
        start = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::get
                          ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                           &cur);
        puVar18 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             &srct);
        utf8::utf16to8<unsigned_short_const*,unsigned_char*>
                  (start,start + (long)src._M_t.
                                       super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                                       .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl,
                   puVar18);
        puVar19 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             &srct);
        std::__cxx11::string::erase(i,(ulong)_unival);
        sVar3 = i;
        pcVar12 = _unival;
        puVar20 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             &srct);
        std::__cxx11::string::insert(sVar3,pcVar12,(ulong)puVar20);
        _unival = _unival + ((long)puVar18 - (long)puVar19);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&srct);
        std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)&cur);
      }
      else {
        pcVar11 = (char *)std::__cxx11::string::operator[](i);
        if (*pcVar11 != '4') goto LAB_00b9d3df;
        if ((jend - (long)pcVar12 & 7) != 0) {
          return false;
        }
        src_1._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)
             (jend - (long)pcVar12 >> 3);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = src_1._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
        uVar15 = SUB168(auVar2 * ZEXT816(4),0);
        if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
          uVar15 = 0xffffffffffffffff;
        }
        __p_00 = (uint *)operator_new__(uVar15);
        std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::
        unique_ptr<unsigned_int*,std::default_delete<unsigned_int[]>,void,bool>
                  ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)&cur_1,__p_00);
        lVar14 = std::__cxx11::string::c_str();
        k_1 = (size_t)(pcVar12 + lVar14);
        for (dcount_1 = 0;
            dcount_1 <
            (ulong)src_1._M_t.
                   super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                   super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
            dcount_1 = dcount_1 + 1) {
          bVar6 = HexOctetToDecimal((char *)k_1);
          bVar7 = HexOctetToDecimal((char *)(k_1 + 2));
          bVar8 = HexOctetToDecimal((char *)(k_1 + 4));
          bVar9 = HexOctetToDecimal((char *)(k_1 + 6));
          puVar21 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::
                    operator[]((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                               &cur_1,dcount_1);
          *puVar21 = (uint)bVar6 << 0x18 | (uint)bVar7 << 0x10 | (uint)bVar8 << 8 | (uint)bVar9;
          k_1 = k_1 + 8;
        }
        dest_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
        .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             ((long)src_1._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl * 5);
        puVar17 = (uchar *)operator_new__((ulong)dest_1._M_t.
                                                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                 .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                 _M_head_impl);
        std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
        unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
                  ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&srct_1,
                   puVar17);
        start_00 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::get
                             ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                              &cur_1);
        puVar18 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             &srct_1);
        utf8::utf32to8<unsigned_char*,unsigned_int_const*>
                  (start_00,start_00 +
                            (long)src_1._M_t.
                                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,puVar18
                  );
        puVar19 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             &srct_1);
        std::__cxx11::string::erase(i,(ulong)_unival);
        sVar3 = i;
        pcVar12 = _unival;
        puVar20 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                             &srct_1);
        std::__cxx11::string::insert(sVar3,pcVar12,(ulong)puVar20);
        _unival = _unival + ((long)puVar18 - (long)puVar19);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&srct_1);
        std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&cur_1);
      }
    }
  } while( true );
}

Assistant:

bool STEP::StringToUTF8(std::string& s)
{
    // very basic handling for escaped string sequences
    // http://doc.spatial.com/index.php?title=InterOp:Connect/STEP&redirect=no

    for (size_t i = 0; i < s.size(); ) {
        if (s[i] == '\\') {
            // \S\X - cp1252 (X is the character remapped to [0,127])
            if (i+3 < s.size() && s[i+1] == 'S' && s[i+2] == '\\') {
                // http://stackoverflow.com/questions/5586214/how-to-convert-char-from-iso-8859-1-to-utf-8-in-c-multiplatformly
                ai_assert((uint8_t)s[i+3] < 0x80);
                const uint8_t ch = s[i+3] + 0x80;

                s[i] = 0xc0 | (ch & 0xc0) >> 6;
                s[i+1] =  0x80 | (ch & 0x3f);

                s.erase(i + 2,2);
                ++i;
            }
            // \X\xx - mac/roman (xx is a hex sequence)
            else if (i+4 < s.size() && s[i+1] == 'X' && s[i+2] == '\\') {

                const uint8_t macval = HexOctetToDecimal(s.c_str() + i + 3);
                if(macval < 0x20) {
                    return false;
                }

                ai_assert(sizeof(mac_codetable) / sizeof(mac_codetable[0]) == 0x100-0x20);

                const uint32_t unival = mac_codetable[macval - 0x20], *univalp = &unival;

                unsigned char temp[5], *tempp = temp;
                ai_assert(sizeof( unsigned char ) == 1);

                utf8::utf32to8( univalp, univalp + 1, tempp );

                const size_t outcount = static_cast<size_t>(tempp-temp);

                s.erase(i,5);
                s.insert(i, reinterpret_cast<char*>(temp), outcount);
                i += outcount;
            }
            // \Xn\ .. \X0\ - various unicode encodings (n=2: utf16; n=4: utf32)
            else if (i+3 < s.size() && s[i+1] == 'X' && s[i+2] >= '0' && s[i+2] <= '9') {
                switch(s[i+2]) {
                    // utf16
                case '2':
                    // utf32
                case '4':
                    if (s[i+3] == '\\') {
                        const size_t basei = i+4;
                        size_t j = basei, jend = s.size()-3;

                        for (; j < jend; ++j) {
                            if (s[j] == '\\' && s[j+1] == 'X' && s[j+2] == '0' && s[j+3] == '\\') {
                                break;
                            }
                        }
                        if (j == jend) {
                            return false;
                        }

                        if (j == basei) {
                            s.erase(i,8);
                            continue;
                        }

                        if (s[i+2] == '2') {
                            if (((j - basei) % 4) != 0) {
                                return false;
                            }

                            const size_t count = (j-basei)/4;
                            std::unique_ptr<uint16_t[]> src(new uint16_t[count]);

                            const char* cur = s.c_str() + basei;
                            for (size_t k = 0; k < count; ++k, cur += 4) {
                                src[k] = (static_cast<uint16_t>(HexOctetToDecimal(cur)) << 8u)  |
                                     static_cast<uint16_t>(HexOctetToDecimal(cur+2));
                            }

                            const size_t dcount = count * 3; // this is enough to hold all possible outputs
                            std::unique_ptr<unsigned char[]> dest(new unsigned char[dcount]);

                            const uint16_t* srct = src.get();
                            unsigned char* destt = dest.get();
                            utf8::utf16to8( srct, srct + count, destt );

                            const size_t outcount = static_cast<size_t>(destt-dest.get());

                            s.erase(i,(j+4-i));

                            ai_assert(sizeof(unsigned char) == 1);
                            s.insert(i, reinterpret_cast<char*>(dest.get()), outcount);

                            i += outcount;
                            continue;
                        }
                        else if (s[i+2] == '4') {
                            if (((j - basei) % 8) != 0) {
                                return false;
                            }

                            const size_t count = (j-basei)/8;
                            std::unique_ptr<uint32_t[]> src(new uint32_t[count]);

                            const char* cur = s.c_str() + basei;
                            for (size_t k = 0; k < count; ++k, cur += 8) {
                                src[k] = (static_cast<uint32_t>(HexOctetToDecimal(cur  )) << 24u) |
                                         (static_cast<uint32_t>(HexOctetToDecimal(cur+2)) << 16u) |
                                         (static_cast<uint32_t>(HexOctetToDecimal(cur+4)) << 8u)  |
                                         (static_cast<uint32_t>(HexOctetToDecimal(cur+6)));
                            }

                            const size_t dcount = count * 5; // this is enough to hold all possible outputs
                            std::unique_ptr<unsigned char[]> dest(new unsigned char[dcount]);

                            const uint32_t* srct = src.get();
                            unsigned char* destt = dest.get();
                            utf8::utf32to8( srct, srct + count, destt );

                            const size_t outcount = static_cast<size_t>(destt-dest.get());

                            s.erase(i,(j+4-i));

                            ai_assert(sizeof(unsigned char) == 1);
                            s.insert(i, reinterpret_cast<char*>(dest.get()), outcount);

                            i += outcount;
                            continue;
                        }
                    }
                    break;

                    // TODO: other encoding patterns?

                default:
                    return false;
                }
            }
        }
        ++i;
    }
    return true;
}